

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O3

char * lj_buf_more2(SBuf *sb,MSize sz)

{
  uint sz_00;
  
  if ((sz < 0x7fffff01) && (sz_00 = ((sb->p).ptr32 - (sb->b).ptr32) + sz, sz_00 < 0x7fffff01)) {
    buf_grow(sb,sz_00);
    return (char *)(ulong)(sb->p).ptr32;
  }
  lj_err_mem((lua_State *)(ulong)(sb->L).ptr32);
}

Assistant:

LJ_NOINLINE char *LJ_FASTCALL lj_buf_more2(SBuf *sb, MSize sz)
{
  MSize len = sbuflen(sb);
  lj_assertG_(G(sbufL(sb)), sz > sbufleft(sb), "SBuf overflow");
  if (LJ_UNLIKELY(sz > LJ_MAX_BUF || len + sz > LJ_MAX_BUF))
    lj_err_mem(sbufL(sb));
  buf_grow(sb, len + sz);
  return sbufP(sb);
}